

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O2

string * __thiscall
anon_unknown.dwarf_578845::Helper::GetDestination
          (string *__return_storage_ptr__,Helper *this,cmInstallCommandArguments *args,
          string *varName,string *guess)

{
  string *psVar1;
  string val;
  char *local_48;
  size_type local_40;
  char local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  
  if ((args != (cmInstallCommandArguments *)0x0) &&
     (psVar1 = cmInstallCommandArguments::GetDestination_abi_cxx11_(args),
     psVar1->_M_string_length != 0)) {
    psVar1 = cmInstallCommandArguments::GetDestination_abi_cxx11_(args);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
    return __return_storage_ptr__;
  }
  psVar1 = cmMakefile::GetSafeDefinition(this->Makefile,varName);
  std::__cxx11::string::string((string *)&local_48,(string *)psVar1);
  if (local_40 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)guess);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_48 == &local_38) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_37,local_38);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_30;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_48;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_37,local_38);
    }
    __return_storage_ptr__->_M_string_length = local_40;
    local_40 = 0;
    local_38 = '\0';
    local_48 = &local_38;
  }
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string Helper::GetDestination(const cmInstallCommandArguments* args,
                                   const std::string& varName,
                                   const std::string& guess) const
{
  if (args && !args->GetDestination().empty()) {
    return args->GetDestination();
  }
  std::string val = this->Makefile->GetSafeDefinition(varName);
  if (!val.empty()) {
    return val;
  }
  return guess;
}